

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall DLevelScript::Unlink(DLevelScript *this)

{
  DLevelScript *pDVar1;
  DLevelScript *pDVar2;
  TObjPtr<DACSThinker> pointing;
  
  if ((DACSThinker::ActiveThinker.field_0 != (DACSThinker *)0x0) &&
     ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) != 0)) {
    DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
  }
  pointing.field_0 = DACSThinker::ActiveThinker.field_0;
  if (*(DLevelScript **)((long)DACSThinker::ActiveThinker.field_0 + 0x50) == this) {
    pDVar1 = this->prev;
    *(DLevelScript **)((long)DACSThinker::ActiveThinker.field_0 + 0x50) = pDVar1;
    if (((pDVar1 != (DLevelScript *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 3) != 0)) &&
       ((*(byte *)((long)pointing.field_0 + 0x20) & 4) != 0)) {
      GC::Barrier((DObject *)pointing.field_0,&pDVar1->super_DObject);
    }
  }
  if (*(DLevelScript **)((long)pointing.field_0 + 0x58) == this) {
    pDVar1 = this->next;
    *(DLevelScript **)((long)pointing.field_0 + 0x58) = pDVar1;
    if (((pDVar1 != (DLevelScript *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 3) != 0)) &&
       ((*(byte *)((long)pointing.field_0 + 0x20) & 4) != 0)) {
      GC::Barrier((DObject *)pointing.field_0,&pDVar1->super_DObject);
    }
  }
  pDVar1 = this->prev;
  if (pDVar1 != (DLevelScript *)0x0) {
    pDVar1->next = this->next;
    pDVar2 = this->next;
    if (((pDVar2 != (DLevelScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 3) != 0)) &&
       (((pDVar1->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pDVar1->super_DObject,&pDVar2->super_DObject);
    }
  }
  pDVar1 = this->next;
  if (pDVar1 != (DLevelScript *)0x0) {
    pDVar1->prev = this->prev;
    pDVar2 = this->prev;
    if (((pDVar2 != (DLevelScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 3) != 0)) &&
       (((pDVar1->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pDVar1->super_DObject,&pDVar2->super_DObject);
      return;
    }
  }
  return;
}

Assistant:

void DLevelScript::Unlink ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	if (controller->LastScript == this)
	{
		controller->LastScript = prev;
		GC::WriteBarrier(controller, prev);
	}
	if (controller->Scripts == this)
	{
		controller->Scripts = next;
		GC::WriteBarrier(controller, next);
	}
	if (prev)
	{
		prev->next = next;
		GC::WriteBarrier(prev, next);
	}
	if (next)
	{
		next->prev = prev;
		GC::WriteBarrier(next, prev);
	}
}